

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadSketch.h
# Opt level: O0

void __thiscall
SpreadSketchWrapper<4U>::SpreadSketchWrapper(SpreadSketchWrapper<4U> *this,int memory,int _HIT)

{
  void *pvVar1;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  int width;
  int in_stack_0000011c;
  int in_stack_00000120;
  int in_stack_00000124;
  int in_stack_00000128;
  int in_stack_0000012c;
  DetectorSS *in_stack_00000130;
  int in_stack_00000140;
  Abstract<4U> *in_stack_ffffffffffffffc0;
  
  Abstract<4U>::Abstract(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_Init_00123d28;
  *(undefined4 *)(in_RDI + 0xd) = in_EDX;
  pvVar1 = operator_new(0x70);
  DetectorSS::DetectorSS
            (in_stack_00000130,in_stack_0000012c,in_stack_00000128,in_stack_00000124,
             in_stack_00000120,in_stack_0000011c,in_stack_00000140);
  in_RDI[0xe] = pvVar1;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"SpreadSketch");
  std::__cxx11::string::operator=((string *)(in_RDI + 9),"\t");
  return;
}

Assistant:

SpreadSketchWrapper(int memory, int _HIT) {
		this->HIT = _HIT;
		// total_mem = cmdepth*cmwidth*(memory+lgn+8)/8
		int width = memory * 8 / 4 / (438 + 32 + 8);
		sketch = new DetectorSS(4, width, 32, 79, 3, 438);
		this->name = "SpreadSketch";
		this->sep = "\t";
	}